

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall
IsorecursiveTest_ForwardReferencedChild_Test::TestBody
          (IsorecursiveTest_ForwardReferencedChild_Test *this)

{
  Nullability NVar1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar4;
  char *in_R9;
  pointer *__ptr;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_88;
  byte local_70;
  AssertHelper local_68;
  TypeBuilder local_60;
  TypeBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  wasm::TypeBuilder::TypeBuilder(&local_60,3);
  wasm::TypeBuilder::createRecGroup((ulong)&local_60,0);
  NVar1 = wasm::TypeBuilder::getTempHeapType((ulong)&local_60);
  uVar2 = wasm::TypeBuilder::getTempRefType((HeapType)&local_60,NVar1);
  NVar1 = wasm::TypeBuilder::getTempHeapType((ulong)&local_60);
  uVar3 = wasm::TypeBuilder::getTempRefType((HeapType)&local_60,NVar1);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  __l._M_len = 1;
  __l._M_array = (iterator)local_30;
  local_30 = (undefined1  [8])uVar2;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l,
             (allocator_type *)&local_20);
  local_88._0_8_ =
       builder.impl._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  local_88._8_8_ = pbStack_50;
  local_88._16_8_ = local_48._M_allocated_capacity;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x0);
  if ((Impl *)local_88._0_8_ != (Impl *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  if (builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
       )0x0) {
    operator_delete((void *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                    local_48._M_allocated_capacity -
                    (long)builder.impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
  }
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_30;
  local_30 = (undefined1  [8])uVar3;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l_00,
             (allocator_type *)&local_20);
  local_88._0_8_ =
       builder.impl._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  local_88._8_8_ = pbStack_50;
  local_88._16_8_ = local_48._M_allocated_capacity;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x1);
  if ((Impl *)local_88._0_8_ != (Impl *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  if (builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
       )0x0) {
    operator_delete((void *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                    local_48._M_allocated_capacity -
                    (long)builder.impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
  }
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x2);
  if ((void *)local_88._0_8_ != (void *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  wasm::TypeBuilder::build();
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == 0) {
    local_30[0] = (internal)(local_70 != 0);
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)local_30,(AssertionResult *)"result","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x124,(char *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
    ;
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &local_48) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      (ulong)(local_48._M_allocated_capacity + 1));
    }
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
  }
  local_30[0] = (internal)(local_70 == 1);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == 1) {
    local_30._0_4_ = 3;
    testing::internal::CmpHelperEQ<wasm::TypeBuilder::ErrorReason,wasm::TypeBuilder::ErrorReason>
              ((internal *)&builder,"error->reason",
               "TypeBuilder::ErrorReason::ForwardChildReference",
               (ErrorReason *)(local_88._M_first._M_storage._M_storage + 8),(ErrorReason *)local_30)
    ;
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_30);
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x128,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)local_30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
      if (local_30 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_50,pbStack_50);
    }
    local_30._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"error->index","1u",(unsigned_long *)&local_88,(uint *)local_30)
    ;
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_30);
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x129,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)local_30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
      if (local_30 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00147483;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_50;
    __ptr_00 = pbStack_50;
  }
  else {
    testing::Message::Message((Message *)&local_20);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_28;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)local_30,(AssertionResult *)"error","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x127,(char *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
    ;
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &local_48) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      (ulong)(local_48._M_allocated_capacity + 1));
    }
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
    __ptr_00 = local_28;
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00147483;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00147483:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_70]._M_data)
            ((anon_class_1_0_00000001 *)&builder,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_88._M_first);
  wasm::TypeBuilder::~TypeBuilder(&local_60);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, ForwardReferencedChild) {
  TypeBuilder builder(3);
  builder.createRecGroup(0, 2);
  Type refA1 = builder.getTempRefType(builder[1], Nullable);
  Type refB0 = builder.getTempRefType(builder[2], Nullable);
  // Forward reference to same group is ok.
  builder[0] = Struct({Field(refA1, Mutable)});
  // Forward reference to different group is not ok.
  builder[1] = Struct({Field(refB0, Mutable)});
  builder[2] = Struct{};

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::ForwardChildReference);
  EXPECT_EQ(error->index, 1u);
}